

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O2

int __thiscall
LASwriteItemCompressed_BYTE14_v4::init(LASwriteItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  U32 context;
  BOOL *pBVar1;
  ByteStreamOutArray **ppBVar2;
  ByteStreamOutArrayLE *this_00;
  ArithmeticEncoder **ppAVar3;
  ArithmeticEncoder *this_01;
  long lVar4;
  undefined7 extraout_var;
  U32 *in_RDX;
  ulong uVar5;
  ulong uVar6;
  
  if (this->outstream_Bytes == (ByteStreamOutArray **)0x0) {
    uVar5 = (ulong)this->number;
    ppBVar2 = (ByteStreamOutArray **)operator_new__(uVar5 << 3);
    this->outstream_Bytes = ppBVar2;
    for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      this_00 = (ByteStreamOutArrayLE *)operator_new(0x40);
      ByteStreamOutArrayLE::ByteStreamOutArrayLE(this_00,0x1000);
      this->outstream_Bytes[uVar6] = (ByteStreamOutArray *)this_00;
      uVar5 = (ulong)this->number;
    }
    ppAVar3 = (ArithmeticEncoder **)operator_new__(uVar5 << 3);
    this->enc_Bytes = ppAVar3;
    for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      this_01 = (ArithmeticEncoder *)operator_new(0x30);
      ArithmeticEncoder::ArithmeticEncoder(this_01);
      this->enc_Bytes[uVar6] = this_01;
      uVar5 = (ulong)this->number;
    }
  }
  else {
    for (uVar6 = 0; uVar5 = (ulong)this->number, uVar6 < uVar5; uVar6 = uVar6 + 1) {
      (*(this->outstream_Bytes[uVar6]->super_ByteStreamOut)._vptr_ByteStreamOut[10])
                (this->outstream_Bytes[uVar6],0);
    }
  }
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    ArithmeticEncoder::init(this->enc_Bytes[uVar6],(EVP_PKEY_CTX *)this->outstream_Bytes[uVar6]);
    uVar5 = (ulong)this->number;
  }
  pBVar1 = this->changed_Bytes;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pBVar1[uVar6] = false;
  }
  for (lVar4 = 0x38; lVar4 != 0x98; lVar4 = lVar4 + 0x18) {
    *(undefined1 *)((long)this->contexts + lVar4 + -0x38) = 1;
  }
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndCompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* on the first init create outstreams and encoders */

  if (outstream_Bytes == 0)
  {
    /* create outstreams pointer array */

    outstream_Bytes = new ByteStreamOutArray*[number];

    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayBE();
      }
    }

    /* create encoder pointer array */

    enc_Bytes = new ArithmeticEncoder*[number];

    /* create layer encoders */

    for (i = 0; i < number; i++)
    {
      enc_Bytes[i] = new ArithmeticEncoder();
    }
  }
  else
  {
    /* otherwise just seek back */

    for (i = 0; i < number; i++)
    {
      outstream_Bytes[i]->seek(0);
    }
  }
  
  /* init layer encoders */

  for (i = 0; i < number; i++)
  {
    enc_Bytes[i]->init(outstream_Bytes[i]);
  }

  /* set changed booleans to FALSE */

  for (i = 0; i < number; i++)
  {
    changed_Bytes[i] = FALSE;
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init context from item)  */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}